

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

string * __thiscall QPDF::getPDFVersion_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  pointer pMVar1;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pMVar1->pdf_version);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getPDFVersion() const
{
    return m->pdf_version;
}